

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool scan_content(TSLexer *lexer,TSSymbol content_symbol,char end_char,uint n_delim,_Bool interp)

{
  undefined3 in_register_00000011;
  _Bool _Var1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  
  iVar3 = lexer->lookahead;
  if (iVar3 != 0) {
    bVar2 = false;
    do {
      (*lexer->mark_end)(lexer);
      _Var1 = bVar2;
      if (interp) {
        if ((iVar3 == 0x24) || (iVar3 == 0x5c)) goto LAB_0015291a;
LAB_001528e7:
        uVar4 = n_delim;
        if (n_delim == 0) {
LAB_00152900:
          _Var1 = true;
          if (!bVar2) {
            (*lexer->mark_end)(lexer);
            content_symbol = end_char == '\"' | 0xe;
          }
LAB_0015291a:
          lexer->result_symbol = content_symbol;
          return _Var1;
        }
        while (lexer->lookahead == CONCAT31(in_register_00000011,end_char)) {
          (*lexer->advance)(lexer,false);
          uVar4 = uVar4 - 1;
          if (uVar4 == 0) goto LAB_00152900;
        }
      }
      else {
        if (iVar3 != 0x5c) goto LAB_001528e7;
        (*lexer->advance)(lexer,false);
        if ((lexer->lookahead == CONCAT31(in_register_00000011,end_char)) ||
           (lexer->lookahead == 0x5c)) goto LAB_0015291a;
      }
      (*lexer->advance)(lexer,false);
      iVar3 = lexer->lookahead;
      bVar2 = true;
    } while (iVar3 != 0);
  }
  return false;
}

Assistant:

static bool scan_content(TSLexer *lexer, TSSymbol content_symbol, char end_char, unsigned n_delim, bool interp) {
    TSSymbol end_symbol = (end_char == '"') ? END_STR : END_CMD;
    bool has_content = false;
    int32_t next;
    while ((next = lexer->lookahead)) {
        mark_end(lexer);
        if (interp && (next == '$' || next == '\\')) {
            lexer->result_symbol = content_symbol;
            return has_content;
        } else if (next == '\\') {
            // Parse backslash in raw strings (check escaped delimiters and '\\')
            advance(lexer);
            next = lexer->lookahead;
            if (next == end_char || next == '\\') {
                lexer->result_symbol = content_symbol;
                return has_content;
            }
        } else {
            bool is_end_delimiter = true;
            for (unsigned i = 1; i <= n_delim; i++) {
                if (lexer->lookahead == end_char) {
                    advance(lexer);
                } else {
                    is_end_delimiter = false;
                    break;
                }
            }
            if (is_end_delimiter) {
                if (has_content) {
                    lexer->result_symbol = content_symbol;
                    return true;
                } else {
                    mark_end(lexer);
                    lexer->result_symbol = end_symbol;
                    return true;
                }
            }
        }
        advance(lexer);
        has_content = true;
    }
    return false;
}